

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O2

void WebPCleanupTransparentArea(WebPPicture *pic)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t *puVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  int *piVar19;
  int iVar20;
  long lVar21;
  uint32_t *puVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  uint8_t *local_a8;
  uint8_t *local_a0;
  ulong local_70;
  ulong uVar9;
  
  if (pic != (WebPPicture *)0x0) {
    iVar3 = pic->width;
    iVar6 = pic->height;
    if (pic->use_argb == 0) {
      local_a8 = pic->y;
      puVar17 = pic->u;
      local_a0 = pic->a;
      auVar26._0_4_ = -(uint)((int)((ulong)local_a0 >> 0x20) == 0 && (int)local_a0 == 0);
      auVar26._4_4_ = -(uint)((int)local_a8 == 0 && (int)((ulong)local_a8 >> 0x20) == 0);
      auVar26._8_4_ = -(uint)((int)((ulong)puVar17 >> 0x20) == 0 && (int)puVar17 == 0);
      auVar26._12_4_ = -(uint)(*(int *)&pic->v == 0 && (int)((ulong)pic->v >> 0x20) == 0);
      iVar13 = movmskps((int)local_a8,auVar26);
      if (iVar13 == 0) {
        iVar13 = pic->y_stride;
        iVar14 = pic->a_stride;
        iVar20 = pic->uv_stride;
        puVar23 = pic->v + -4;
        puVar17 = puVar17 + -4;
        local_70 = 0;
        uVar15 = 0;
        uVar16 = 0;
        iVar11 = 0;
        while (iVar11 + 8 <= iVar6) {
          uVar1 = 0;
          puVar18 = puVar17;
          puVar24 = puVar23;
          bVar25 = false;
          uVar8 = 0;
          while (bVar5 = bVar25, uVar9 = uVar1, uVar1 = uVar9 + 8, (long)uVar1 <= (long)iVar3) {
            iVar12 = SmoothenBlock(local_a0 + uVar9,iVar14,local_a8 + uVar9,iVar13,8,8);
            puVar24 = puVar24 + 4;
            puVar18 = puVar18 + 4;
            bVar25 = false;
            if (iVar12 != 0) {
              pbVar4 = local_a8 + uVar9;
              if (!bVar5) {
                local_70 = (ulong)*pbVar4;
                uVar15 = (uint)puVar18[uVar8 >> 1];
                uVar16 = (uint)puVar24[uVar8 >> 1];
              }
              iVar12 = 8;
              while (bVar25 = iVar12 != 0, iVar12 = iVar12 + -1, bVar25) {
                *(ulong *)pbVar4 = local_70 * 0x101010101010101;
                pbVar4 = pbVar4 + iVar13;
              }
              piVar19 = (int *)(puVar18 + (uVar8 >> 1));
              iVar12 = 4;
              while (bVar25 = iVar12 != 0, iVar12 = iVar12 + -1, bVar25) {
                *piVar19 = uVar15 * 0x1010101;
                piVar19 = (int *)((long)piVar19 + (long)iVar20);
              }
              piVar19 = (int *)(puVar24 + (uVar8 >> 1));
              iVar12 = 4;
              while (bVar25 = iVar12 != 0, iVar12 = iVar12 + -1, bVar25) {
                *piVar19 = uVar16 * 0x1010101;
                piVar19 = (int *)((long)piVar19 + (long)iVar20);
              }
              puVar18 = puVar17;
              puVar24 = puVar23;
              bVar25 = true;
              uVar8 = uVar1;
            }
          }
          if ((int)uVar9 < iVar3) {
            SmoothenBlock(local_a0 + (uVar9 & 0xffffffff),iVar14,local_a8 + (uVar9 & 0xffffffff),
                          iVar13,iVar3 - (int)uVar9,8);
          }
          local_a0 = local_a0 + (long)iVar14 * 8;
          local_a8 = local_a8 + iVar13 * 8;
          puVar23 = puVar23 + iVar20 * 4;
          puVar17 = puVar17 + iVar20 * 4;
          iVar11 = iVar11 + 8;
        }
        iVar20 = iVar6 - iVar11;
        if (iVar20 != 0 && iVar11 <= iVar6) {
          lVar21 = 0;
          while (lVar21 + 8 <= (long)iVar3) {
            SmoothenBlock(local_a0 + lVar21,iVar14,local_a8 + lVar21,iVar13,8,iVar20);
            lVar21 = lVar21 + 8;
          }
          if ((int)lVar21 < iVar3) {
            SmoothenBlock(local_a0 + lVar21,iVar14,local_a8 + lVar21,iVar13,iVar3 - (int)lVar21,
                          iVar20);
            return;
          }
        }
      }
    }
    else {
      iVar6 = iVar6 / 8;
      iVar3 = iVar3 / 8;
      uVar7 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      for (iVar13 = 0; iVar13 != iVar6; iVar13 = iVar13 + 1) {
        bVar25 = true;
        for (iVar14 = 0; iVar14 != iVar3; iVar14 = iVar14 + 1) {
          iVar20 = pic->argb_stride;
          iVar11 = (iVar20 * iVar13 + iVar14) * 8;
          puVar10 = pic->argb;
          puVar22 = puVar10 + iVar11;
          for (iVar12 = 0; iVar12 != 8; iVar12 = iVar12 + 1) {
            lVar21 = 0;
            while (lVar21 != 8) {
              puVar2 = puVar22 + lVar21;
              lVar21 = lVar21 + 1;
              if (0xffffff < *puVar2) {
                bVar25 = true;
                goto LAB_0015b451;
              }
            }
            puVar22 = puVar22 + iVar20;
          }
          if (bVar25) {
            uVar7 = puVar10[iVar11];
          }
          puVar10 = puVar10 + iVar11;
          bVar25 = false;
          for (iVar11 = 0; iVar11 != 8; iVar11 = iVar11 + 1) {
            for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
              puVar10[lVar21] = uVar7;
            }
            puVar10 = puVar10 + iVar20;
          }
LAB_0015b451:
        }
      }
    }
  }
  return;
}

Assistant:

void WebPCleanupTransparentArea(WebPPicture* pic) {
  int x, y, w, h;
  if (pic == NULL) return;
  w = pic->width / SIZE;
  h = pic->height / SIZE;

  // note: we ignore the left-overs on right/bottom, except for SmoothenBlock().
  if (pic->use_argb) {
    uint32_t argb_value = 0;
    for (y = 0; y < h; ++y) {
      int need_reset = 1;
      for (x = 0; x < w; ++x) {
        const int off = (y * pic->argb_stride + x) * SIZE;
        if (IsTransparentARGBArea(pic->argb + off, pic->argb_stride, SIZE)) {
          if (need_reset) {
            argb_value = pic->argb[off];
            need_reset = 0;
          }
          FlattenARGB(pic->argb + off, argb_value, pic->argb_stride, SIZE);
        } else {
          need_reset = 1;
        }
      }
    }
  } else {
    const int width = pic->width;
    const int height = pic->height;
    const int y_stride = pic->y_stride;
    const int uv_stride = pic->uv_stride;
    const int a_stride = pic->a_stride;
    uint8_t* y_ptr = pic->y;
    uint8_t* u_ptr = pic->u;
    uint8_t* v_ptr = pic->v;
    const uint8_t* a_ptr = pic->a;
    int values[3] = { 0 };
    if (a_ptr == NULL || y_ptr == NULL || u_ptr == NULL || v_ptr == NULL) {
      return;
    }
    for (y = 0; y + SIZE <= height; y += SIZE) {
      int need_reset = 1;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        if (SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                          SIZE, SIZE)) {
          if (need_reset) {
            values[0] = y_ptr[x];
            values[1] = u_ptr[x >> 1];
            values[2] = v_ptr[x >> 1];
            need_reset = 0;
          }
          Flatten(y_ptr + x,        values[0], y_stride,  SIZE);
          Flatten(u_ptr + (x >> 1), values[1], uv_stride, SIZE2);
          Flatten(v_ptr + (x >> 1), values[2], uv_stride, SIZE2);
        } else {
          need_reset = 1;
        }
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, SIZE);
      }
      a_ptr += SIZE * a_stride;
      y_ptr += SIZE * y_stride;
      u_ptr += SIZE2 * uv_stride;
      v_ptr += SIZE2 * uv_stride;
    }
    if (y < height) {
      const int sub_height = height - y;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      SIZE, sub_height);
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, sub_height);
      }
    }
  }
}